

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O3

void TPZShapeHDiv<pzshape::TPZShapePrism>::ComputeVecandShape(TPZShapeData *data)

{
  pair<int,_long> *ppVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  MElementType MVar10;
  int *piVar11;
  ostream *this;
  long *plVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int iside;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int maxorder [3];
  TPZGenMatrix<int> shapeorders;
  TPZManVector<int,_27> permgather;
  TPZManVector<int,_10> facevector;
  TPZManVector<int,_63> VectorSides;
  TPZManVector<int,_63> normalsides;
  TPZManVector<int,_81> vecpermute;
  TPZManVector<int,_63> directions;
  TPZManVector<int,_63> bilinear;
  int local_7ec [3];
  TPZVec<int> *local_7e0;
  ulong local_7d8;
  long local_7d0;
  ulong local_7c8;
  ulong local_7c0;
  long local_7b8;
  int local_7ac;
  long local_7a8;
  TPZManVector<int,_10> local_7a0;
  undefined1 local_758 [24];
  undefined1 local_740 [16];
  TPZManVector<int,_10> local_660;
  TPZVec<int> local_618;
  int local_5f8 [64];
  TPZVec<int> local_4f8;
  int local_4d8 [64];
  TPZVec<int> local_3d8;
  int local_3b8 [82];
  TPZVec<int> local_270;
  int local_250 [64];
  TPZVec<int> local_150;
  int local_130 [64];
  
  TPZVec<int>::TPZVec(&local_618,0);
  local_618._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd8f0;
  local_618.fStore = local_5f8;
  local_618.fNElements = 0x3f;
  local_618.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_150,0);
  local_150.fStore = local_130;
  local_150._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd8f0;
  local_150.fNElements = 0x3f;
  local_150.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_270,0);
  local_270.fStore = local_250;
  local_270._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd8f0;
  local_270.fNElements = 0x3f;
  local_270.fNAlloc = 0;
  TPZVec<int>::TPZVec(&local_4f8,0);
  local_4f8.fStore = local_4d8;
  local_4f8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd8f0;
  local_4f8.fNElements = 0x3f;
  local_4f8.fNAlloc = 0;
  pztopology::TPZPrism::GetSideHDivDirections(&local_618,&local_270,&local_150,&local_4f8);
  if ((data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x6c);
  }
  local_7ac = (data->fHDivConnectOrders).super_TPZVec<int>.fStore[5];
  iVar6 = pzshape::TPZShapePrism::NShapeF(&(data->fH1ConnectOrders).super_TPZVec<int>);
  local_3d8._vptr_TPZVec = (_func_int **)CONCAT44(local_3d8._vptr_TPZVec._4_4_,0x14);
  TPZManVector<int,_10>::TPZManVector(&local_660,local_618.fNElements,(int *)&local_3d8);
  local_7d8 = CONCAT44(local_7d8._4_4_,iVar6);
  uVar17 = 0;
  local_7e0 = &(data->fH1ConnectOrders).super_TPZVec<int>;
  TPZVec<int>::TPZVec(&local_3d8,0);
  local_3d8.fStore = local_3b8;
  local_3d8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd738;
  local_3d8.fNElements = 0x3f;
  local_3d8.fNAlloc = 0;
  iVar6 = 0;
  do {
    iVar7 = pztopology::TPZPrism::SideDimension(iVar6);
    if (iVar7 == 2) {
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_7a0);
      pztopology::TPZPrism::LowerDimensionSides(iVar6,(TPZStack<int,_10> *)&local_7a0);
      uVar5 = (uint)local_7a0.super_TPZVec<int>.fNElements;
      uVar9 = (uint)local_7a0.super_TPZVec<int>.fNElements + 1;
      TPZManVector<int,_27>::TPZManVector((TPZManVector<int,_27> *)local_758,(long)(int)uVar9);
      HDivPermutation(iVar6,data,(TPZVec<int> *)local_758);
      if (uVar5 < 0x7fffffff) {
        iVar7 = (int)uVar17;
        uVar17 = 0;
        do {
          local_3d8.fStore[(long)iVar7 + uVar17] = *(int *)(local_758._8_8_ + uVar17 * 4) + iVar7;
          local_660.super_TPZVec<int>.fStore[(long)iVar7 + uVar17] = iVar6;
          uVar17 = uVar17 + 1;
        } while (uVar9 != uVar17);
        uVar17 = (ulong)(uint)(iVar7 + (int)uVar17);
      }
      if ((undefined1 *)local_758._8_8_ != local_740 + 8) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_740._8_8_;
        local_740 = auVar2 << 0x40;
        local_758._0_8_ = &PTR__TPZVec_01813ef0;
        if ((long *)local_758._8_8_ != (long *)0x0) {
          operator_delete__((void *)local_758._8_8_);
        }
      }
      TPZManVector<int,_10>::~TPZManVector(&local_7a0);
    }
    auVar4 = _DAT_014d28c0;
    auVar2 = _DAT_014d28b0;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x15);
  lVar18 = (long)(int)uVar17;
  lVar13 = local_3d8.fNElements - lVar18;
  if (lVar13 != 0 && lVar18 <= local_3d8.fNElements) {
    lVar14 = lVar13 + -1;
    auVar21._8_4_ = (int)lVar14;
    auVar21._0_8_ = lVar14;
    auVar21._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar15 = 0;
    auVar21 = auVar21 ^ _DAT_014d28c0;
    uVar16 = uVar17;
    do {
      auVar22._8_4_ = (int)uVar15;
      auVar22._0_8_ = uVar15;
      auVar22._12_4_ = (int)(uVar15 >> 0x20);
      auVar22 = (auVar22 | auVar2) ^ auVar4;
      iVar6 = (int)uVar16;
      if ((bool)(~(auVar22._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar22._0_4_ ||
                  auVar21._4_4_ < auVar22._4_4_) & 1)) {
        local_3d8.fStore[lVar18 + uVar15] = iVar6;
      }
      if ((auVar22._12_4_ != auVar21._12_4_ || auVar22._8_4_ <= auVar21._8_4_) &&
          auVar22._12_4_ <= auVar21._12_4_) {
        local_3d8.fStore[lVar18 + uVar15 + 1] = iVar6 + 1;
      }
      uVar15 = uVar15 + 2;
      uVar16 = (ulong)(iVar6 + 2);
    } while ((lVar13 + 1U & 0xfffffffffffffffe) != uVar15);
  }
  TPZGenMatrix<int>::TPZGenMatrix((TPZGenMatrix<int> *)&local_7a0,(long)(int)local_7d8,3);
  pzshape::TPZShapePrism::ShapeOrder
            (&(data->fCornerNodeIds).super_TPZVec<long>,local_7e0,(TPZGenMatrix<int> *)&local_7a0);
  iVar6 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore[5];
  iVar7 = 0;
  TPZVec<long>::TPZVec((TPZVec<long> *)local_758,0);
  local_758._0_8_ = &PTR__TPZManVector_018bd790;
  local_758._8_8_ = local_740 + 8;
  local_758._16_8_ = 0x16;
  local_740 = (undefined1  [16])0x0;
  uVar16 = 0;
  do {
    iVar8 = 1;
    if (5 < uVar16) {
      iVar8 = iVar6 + 1;
    }
    iVar8 = pzshape::TPZShapePrism::NConnectShapeF((int)uVar16,iVar8);
    iVar7 = iVar7 + iVar8;
    *(long *)(local_758._8_8_ + (uVar16 + 1) * 8) = (long)iVar7;
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x15);
  local_7a8 = local_618.fNElements;
  local_7d0 = lVar18;
  if ((int)uVar17 < 1) {
    uVar16 = 0;
  }
  else {
    uVar15 = 0;
    uVar16 = 0;
    local_7c8 = uVar17;
    do {
      local_7b8 = (long)local_3d8.fStore[uVar15];
      local_7e0 = (TPZVec<int> *)(long)local_618.fStore[local_7b8];
      lVar13 = *(long *)(local_758._8_8_ + (undefined1 *)((long)&local_7e0->_vptr_TPZVec + 1) * 8);
      local_7c0 = uVar15;
      if ((int)*(long *)(local_758._8_8_ + local_7e0 * 8) < (int)lVar13) {
        iVar6 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore
                [(long)local_660.super_TPZVec<int>.fStore[uVar15] + -0xf];
        lVar18 = (long)(int)*(long *)(local_758._8_8_ + local_7e0 * 8);
        do {
          uVar9 = pztopology::TPZPrism::SideDimension((int)local_7e0);
          if ((int)uVar9 < 1) {
LAB_0100b097:
            iVar7 = (int)uVar16;
            ppVar1 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
            ppVar1[iVar7].first = (int)local_7b8;
            ppVar1[iVar7].second = lVar18;
            uVar16 = (ulong)(iVar7 + 1);
          }
          else {
            bVar3 = true;
            uVar17 = 0;
            local_7d8 = uVar16;
            do {
              piVar11 = TPZGenMatrix<int>::operator()((TPZGenMatrix<int> *)&local_7a0,lVar18,uVar17)
              ;
              if (iVar6 < *piVar11) {
                bVar3 = false;
              }
              uVar17 = uVar17 + 1;
            } while (uVar9 != uVar17);
            uVar16 = local_7d8;
            if (bVar3) goto LAB_0100b097;
          }
          lVar18 = lVar18 + 1;
        } while ((int)lVar18 != (int)lVar13);
      }
      uVar15 = local_7c0 + 1;
    } while (uVar15 != local_7c8);
  }
  lVar13 = local_7d0;
  if (local_7d0 < local_7a8) {
    do {
      local_7b8 = (long)local_3d8.fStore[lVar13];
      iVar6 = local_618.fStore[local_7b8];
      local_7e0 = (TPZVec<int> *)CONCAT44(local_7e0._4_4_,local_150.fStore[local_7b8]);
      local_7c0 = (ulong)local_270.fStore[local_7b8];
      local_7d0 = lVar13;
      MVar10 = pztopology::TPZPrism::Type(iVar6);
      lVar13 = *(long *)(local_758._8_8_ + ((long)iVar6 + 1) * 8);
      if ((int)*(long *)(local_758._8_8_ + (long)iVar6 * 8) < (int)lVar13) {
        lVar18 = (long)(int)*(long *)(local_758._8_8_ + (long)iVar6 * 8);
        local_7c8 = CONCAT44(local_7c8._4_4_,iVar6);
        do {
          uVar9 = pztopology::TPZPrism::SideDimension(iVar6);
          local_7ec[0] = local_7ac;
          local_7ec[1] = local_7ac;
          local_7ec[2] = local_7ac;
          if ((int)local_7e0 != 0) {
            local_7ec[local_7c0] = local_7ec[local_7c0] + 1;
          }
          if ((int)uVar9 < 1) {
LAB_0100b274:
            iVar7 = (int)uVar16;
            ppVar1 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
            ppVar1[iVar7].first = (int)local_7b8;
            ppVar1[iVar7].second = lVar18;
            uVar16 = (ulong)(iVar7 + 1);
          }
          else {
            bVar3 = true;
            uVar17 = 0;
            local_7d8 = uVar16;
            do {
              switch(MVar10) {
              case EOned:
                piVar11 = TPZGenMatrix<int>::operator()((TPZGenMatrix<int> *)&local_7a0,lVar18,0);
                break;
              case ETriangle:
              case ETetraedro:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_7a0,lVar18,uVar17);
                iVar8 = local_7ec[uVar17] + 1;
                iVar6 = *piVar11;
                bVar20 = SBORROW4(iVar6,iVar8);
                iVar7 = iVar6 - iVar8;
                bVar19 = iVar6 == iVar8;
                goto LAB_0100b24b;
              case EQuadrilateral:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_7a0,lVar18,uVar17);
                break;
              case EPiramide:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_7a0,lVar18,uVar17);
                break;
              case EPrisma:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_7a0,lVar18,uVar17);
                break;
              case ECube:
                piVar11 = TPZGenMatrix<int>::operator()
                                    ((TPZGenMatrix<int> *)&local_7a0,lVar18,uVar17);
                break;
              default:
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
                           ,0x104);
              }
              iVar8 = *piVar11;
              iVar6 = local_7ec[uVar17];
              bVar20 = SBORROW4(iVar8,iVar6);
              iVar7 = iVar8 - iVar6;
              bVar19 = iVar8 == iVar6;
LAB_0100b24b:
              if (!bVar19 && bVar20 == iVar7 < 0) {
                bVar3 = false;
              }
              uVar17 = uVar17 + 1;
            } while (uVar9 != uVar17);
            uVar16 = local_7d8;
            iVar6 = (int)local_7c8;
            if (bVar3) goto LAB_0100b274;
          }
          lVar18 = lVar18 + 1;
        } while ((int)lVar18 != (int)lVar13);
      }
      lVar13 = local_7d0 + 1;
    } while (local_7d0 + 1 < local_7a8);
  }
  iVar6 = (int)(data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements;
  if ((int)uVar16 == iVar6) {
    if ((undefined1 *)local_758._8_8_ != local_740 + 8) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_740._8_8_;
      local_740 = auVar4 << 0x40;
      local_758._0_8_ = &PTR__TPZVec_01813f30;
      if ((long *)local_758._8_8_ != (long *)0x0) {
        operator_delete__((void *)local_758._8_8_);
      }
    }
    TPZGenMatrix<int>::~TPZGenMatrix((TPZGenMatrix<int> *)&local_7a0);
    if (local_3d8.fStore != local_3b8) {
      local_3d8.fNAlloc = 0;
      local_3d8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_3d8.fStore != (int *)0x0) {
        operator_delete__(local_3d8.fStore);
      }
    }
    TPZManVector<int,_10>::~TPZManVector(&local_660);
    if (local_4f8.fStore != local_4d8) {
      local_4f8.fNAlloc = 0;
      local_4f8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_4f8.fStore != (int *)0x0) {
        operator_delete__(local_4f8.fStore);
      }
    }
    if (local_270.fStore != local_250) {
      local_270.fNAlloc = 0;
      local_270._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_270.fStore != (int *)0x0) {
        operator_delete__(local_270.fStore);
      }
    }
    if (local_150.fStore != local_130) {
      local_150.fNAlloc = 0;
      local_150._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_150.fStore != (int *)0x0) {
        operator_delete__(local_150.fStore);
      }
    }
    if (local_618.fStore != local_5f8) {
      local_618.fNAlloc = 0;
      local_618._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
      if (local_618.fStore != (int *)0x0) {
        operator_delete__(local_618.fStore);
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"count ",6);
  this = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar16);
  std::__ostream_insert<char,std::char_traits<char>>(this,"\nivs ",5);
  plVar12 = (long *)std::ostream::operator<<(this,iVar6);
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x113);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeVecandShape(TPZShapeData &data) {
    const int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    TPZManVector<int,numvec> VectorSides(numvec),bilinear(numvec),directions(numvec);
    TPZManVector<int,numvec> normalsides(numvec);

    TSHAPE::GetSideHDivDirections(VectorSides,directions,bilinear,normalsides);

    if (data.fSDVecShapeIndex.size() == 0) {
        DebugStop();
    }
    
    // const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];//TODOPHIL
    const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];

    int nshape = TSHAPE::NShapeF(data.fH1ConnectOrders);

    int nexternalvectors = 0;
    TPZManVector<int> facevector(VectorSides.size(),TSHAPE::NSides-1);
    // compute the permutation which needs to be applied to the vectors to enforce compatibility between neighbours
    TPZManVector<int,81> vecpermute(TSHAPE::NSides*TSHAPE::Dimension);
    if (TSHAPE::Type() == EPiramide) {
        DebugStop();
    }
    int count = 0;
    for (int side = 0; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension -1) {
            continue;
        }
        TPZStack<int> smallsides;
        TSHAPE::LowerDimensionSides(side,smallsides);
//        TPZGeoElSide gelside(gel,side);
//        int nlowdim = gelside.NSides();
        const int nlowdim = smallsides.NElements()+1;
        TPZManVector<int,27> permgather(nlowdim);
        HDivPermutation(side,data, permgather);
        int counthold = count;
        for (int i=0; i<nlowdim; i++) {
            vecpermute[counthold+i] = permgather[i]+counthold;
            facevector[count] = side;
            count++;
        }
    }

    nexternalvectors = count;
    for (; count < vecpermute.size(); count++) {
        vecpermute[count] = count;
    }
    TPZGenMatrix<int> shapeorders(nshape,3);
    TSHAPE::ShapeOrder(data.fCornerNodeIds, data.fH1ConnectOrders, shapeorders);

//    int nshapeflux = NFluxShapeF();
//    IndexVecShape.Resize(nshapeflux);

    int scalarorder = data.fHDivConnectOrders[TSHAPE::NFacets]+1;
    // VectorSide indicates the side associated with each vector entry
    TPZManVector<int64_t,27> FirstIndex(TSHAPE::NSides+1);
    // the first index of the shape functions
    FirstShapeIndex(FirstIndex,scalarorder);

    int64_t nvec = VectorSides.NElements();
    count = 0;

    const int firstface = TSHAPE::NSides-TSHAPE::NFacets-1;
    for (int locvec = 0; locvec<nexternalvectors; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int face = facevector[locvec];
//        int connectindex = SideConnectLocId(0, face);
        int connectindex = face-firstface;
//        int order = this->Connect(connectindex).Order();
        //int order = data.fHDivConnectOrders[connectindex];
        int order = data.fHDivConnectOrders[connectindex];//TODOPHIL

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (shapeorders(ish,d) > order) {
                    include = false;
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }


    for (int locvec = nexternalvectors; locvec<nvec; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int bil = bilinear[ivec];
        int dir = directions[ivec];
        MElementType tipo = TSHAPE::Type(side);

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int maxorder[3] = {pressureorder,pressureorder,pressureorder};
            if (bil) {
                maxorder[dir]++;
            }
            int shord[3] = {0};
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (tipo==ETriangle||tipo==ETetraedro)//
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d]+1;
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==EQuadrilateral)
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d];
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==ECube)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo==EPrisma)
                {
                    //DebugStop();
                    if (shapeorders(ish,d) > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EOned)
                {
                    shord[0] = shapeorders(ish,0);
                    if (shord[0] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EPiramide)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else
                {
                    DebugStop();
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }

    int ivs =  data.fSDVecShapeIndex.size();
    if (count != ivs) {
        std::cout<<"count "<<count
                 <<"\nivs "<<ivs<<std::endl;
        DebugStop();
    }
    
}